

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

void __thiscall
cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache(cbtSortedOverlappingPairCache *this)

{
  cbtBroadphasePair *pcVar1;
  cbtBroadphasePair *pcVar2;
  long lVar3;
  long lVar4;
  
  (this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
  _vptr_cbtOverlappingPairCallback = (_func_int **)&PTR__cbtSortedOverlappingPairCache_00b6f490;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (cbtBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_blockedForChanges = false;
  this->m_hasDeferredRemoval = true;
  this->m_overlapFilterCallback = (cbtOverlapFilterCallback *)0x0;
  this->m_ghostPairCallback = (cbtOverlappingPairCallback *)0x0;
  pcVar2 = (cbtBroadphasePair *)cbtAlignedAllocInternal(0x40,0x10);
  lVar3 = (long)(this->m_overlappingPairArray).m_size;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      pcVar1 = (this->m_overlappingPairArray).m_data;
      *(undefined8 *)((long)&pcVar2->m_pProxy0 + lVar4) =
           *(undefined8 *)((long)&pcVar1->m_pProxy0 + lVar4);
      *(undefined8 *)((long)&pcVar2->m_pProxy1 + lVar4) =
           *(undefined8 *)((long)&pcVar1->m_pProxy1 + lVar4);
      *(undefined8 *)((long)&pcVar2->m_algorithm + lVar4) =
           *(undefined8 *)((long)&pcVar1->m_algorithm + lVar4);
      *(undefined8 *)((long)&pcVar2->field_3 + lVar4) =
           *(undefined8 *)((long)&pcVar1->field_3 + lVar4);
      lVar4 = lVar4 + 0x20;
    } while (lVar3 * 0x20 != lVar4);
  }
  pcVar1 = (this->m_overlappingPairArray).m_data;
  if (pcVar1 != (cbtBroadphasePair *)0x0) {
    if ((this->m_overlappingPairArray).m_ownsMemory == true) {
      cbtAlignedFreeInternal(pcVar1);
    }
    (this->m_overlappingPairArray).m_data = (cbtBroadphasePair *)0x0;
  }
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = pcVar2;
  (this->m_overlappingPairArray).m_capacity = 2;
  return;
}

Assistant:

cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache() : m_blockedForChanges(false),
															   m_hasDeferredRemoval(true),
															   m_overlapFilterCallback(0),
															   m_ghostPairCallback(0)
{
	int initialAllocatedSize = 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}